

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall testing::internal::ExpectationBase::~ExpectationBase(ExpectationBase *this)

{
  ExpectationBase *this_local;
  
  this->_vptr_ExpectationBase = (_func_int **)&PTR__ExpectationBase_0021a670;
  Mutex::~Mutex(&this->mutex_);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::~vector(&this->untyped_actions_);
  ExpectationSet::~ExpectationSet(&this->immediate_prerequisites_);
  Cardinality::~Cardinality(&this->cardinality_);
  std::__cxx11::string::~string((string *)&this->source_text_);
  return;
}

Assistant:

ExpectationBase::~ExpectationBase() {}